

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall GLDrawList::MakeSortList(GLDrawList *this)

{
  uint uVar1;
  SortNode *pSVar2;
  SortNode *pSVar3;
  SortNode *pSVar4;
  uint uVar5;
  
  this->SortNodeStart = SortNodes.usecount;
  pSVar2 = StaticSortNodeArray::GetNew(&SortNodes);
  pSVar4 = (SortNode *)0x0;
  for (uVar5 = 0; pSVar3 = pSVar2, uVar1 = (this->drawitems).Count, uVar5 < uVar1; uVar5 = uVar5 + 1
      ) {
    pSVar3->itemindex = uVar5;
    pSVar3->right = (SortNode *)0x0;
    pSVar3->left = (SortNode *)0x0;
    pSVar3->equal = (SortNode *)0x0;
    pSVar3->parent = pSVar4;
    if (uVar5 == uVar1 - 1) {
      pSVar2 = pSVar3;
      pSVar4 = (SortNode *)0x0;
    }
    else {
      pSVar2 = StaticSortNodeArray::GetNew(&SortNodes);
      pSVar4 = pSVar2;
    }
    pSVar3->next = pSVar4;
    pSVar4 = pSVar3;
  }
  return;
}

Assistant:

void GLDrawList::MakeSortList()
{
	SortNode * p, * n, * c;
	unsigned i;

	SortNodeStart=SortNodes.Size();
	p=NULL;
	n=SortNodes.GetNew();
	for(i=0;i<drawitems.Size();i++)
	{
		n->itemindex=(int)i;
		n->left=n->equal=n->right=NULL;
		n->parent=p;
		p=n;
		if (i!=drawitems.Size()-1)
		{
			c=SortNodes.GetNew();
			n->next=c;
			n=c;
		}
		else
		{
			n->next=NULL;
		}
	}
}